

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O0

nsync_time __thiscall nsync::nsync_time_sleep(nsync *this,nsync_time delay)

{
  int iVar1;
  nsync_time nVar2;
  nsync_time nVar3;
  __time_t local_b8;
  __syscall_slong_t local_b0;
  nsync_time actual_end;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  nanoseconds delay_ns;
  nsync_time expected_end;
  nsync_time start;
  nsync_time delay_local;
  nsync_time remain;
  
  nVar2 = nsync_time_now();
  nVar3.tv_nsec = delay.tv_sec;
  nVar3.tv_sec = (__time_t)this;
  delay_ns.__r = (rep)this;
  nVar3 = nsync_time_add(nVar2,nVar3);
  actual_end.tv_nsec = delay.tv_sec + (long)this * 1000000000;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_70,&actual_end.tv_nsec);
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_70);
  nVar2 = nsync_time_now();
  iVar1 = nsync_time_cmp(nVar2,nVar3);
  if (iVar1 < 0) {
    nVar3 = nsync_time_sub(nVar3,nVar2);
    local_b8 = nVar3.tv_sec;
    delay_local.tv_nsec = local_b8;
    local_b0 = nVar3.tv_nsec;
    remain.tv_sec = local_b0;
  }
  else {
    delay_local.tv_nsec = 0;
    remain.tv_sec = 0;
  }
  nVar2.tv_nsec = remain.tv_sec;
  nVar2.tv_sec = delay_local.tv_nsec;
  return nVar2;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	nsync_time start = nsync_time_now ();
	nsync_time expected_end = nsync_time_add (start, delay);
	nsync_time remain;
	std::chrono::nanoseconds delay_ns(NSYNC_TIME_NSEC (delay) +
					  NSYNC_NS_IN_S_ * (int64_t) NSYNC_TIME_SEC (delay));
	std::this_thread::sleep_for (delay_ns);
	nsync_time actual_end = nsync_time_now ();
	if (nsync_time_cmp (actual_end, expected_end) < 0) {
		remain = nsync_time_sub (expected_end, actual_end);
	} else {
		remain = nsync_time_zero;
	}
	return (remain);
}